

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall
CompilerContext::compile_condition(CompilerContext *this,SyntaxTree *node,bool not_flag)

{
  NodeType NVar1;
  unreachable_exception *this_00;
  
  for (; NVar1 = node->type_, NVar1 == NOT;
      node = (((node->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
    not_flag = (bool)(not_flag ^ 1);
  }
  if (NVar1 - Equal < 5) {
    compile_expr(this,node,(bool)(not_flag & 1));
    return;
  }
  if (NVar1 == Command) {
    compile_command(this,node,(bool)(not_flag & 1));
    return;
  }
  this_00 = (unreachable_exception *)__cxa_allocate_exception(0x10);
  unreachable_exception::unreachable_exception
            (this_00,
             "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(597)."
            );
  __cxa_throw(this_00,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CompilerContext::compile_condition(const SyntaxTree& node, bool not_flag)
{
    // also see compile_conditions
    switch(node.type())
    {
        case NodeType::NOT:
            return compile_condition(node.child(0), !not_flag);
        case NodeType::Command:
            return compile_command(node, not_flag);
        case NodeType::Equal:
        case NodeType::Greater:
        case NodeType::GreaterEqual:
        case NodeType::Lesser:
        case NodeType::LesserEqual:
            return compile_expr(node, not_flag);
        default:
            Unreachable();
    }
}